

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileBlockManager::WriteHeader(SingleFileBlockManager *this,DatabaseHeader header)

{
  _Rb_tree_header *p_Var1;
  optional_idx *this_00;
  FileBuffer *this_01;
  optional_idx *this_02;
  data_ptr_t pdVar2;
  int iVar3;
  MetadataManager *pMVar4;
  _Rb_tree_node_base *p_Var5;
  DBConfig *pDVar6;
  pointer pFVar7;
  idx_t iVar8;
  Allocator *allocator_p;
  data_ptr_t __src;
  FatalException *this_03;
  long lVar9;
  idx_t *piVar10;
  idx_t *piVar11;
  __node_base *p_Var12;
  _Hash_node_base *p_Var13;
  byte bVar14;
  MetaBlockPointer MVar15;
  vector<duckdb::MetadataHandle,_true> free_list_blocks;
  MemoryStream serializer;
  MainHeader in_stack_fffffffffffffe38;
  _Hash_node_base *local_160;
  MetadataManager *local_158;
  pthread_mutex_t *local_150;
  vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_> local_148;
  MetadataWriter local_128;
  vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_> local_d8;
  undefined8 local_c0;
  vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_> local_b8;
  idx_t local_98 [13];
  
  bVar14 = 0;
  GetFreeListBlocks((vector<duckdb::MetadataHandle,_true> *)&local_148,this);
  pMVar4 = BlockManager::GetMetadataManager(&this->super_BlockManager);
  MetadataManager::MarkBlocksAsModified(pMVar4);
  local_150 = (pthread_mutex_t *)&this->block_lock;
  iVar3 = pthread_mutex_lock(local_150);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  header.iteration = this->iteration_count + 1;
  this->iteration_count = header.iteration;
  p_Var12 = &(this->modified_blocks)._M_h._M_before_begin;
  local_158 = pMVar4;
  while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->free_list,(long *)(p_Var12 + 1));
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->newly_freed_list,(long *)(p_Var12 + 1));
  }
  ::std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->modified_blocks)._M_h);
  if (local_148.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_148.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    header.free_list = 0xffffffffffffffff;
  }
  else {
    local_b8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_148.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_148.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_b8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_148.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_148.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MetadataWriter::MetadataWriter
              (&local_128,local_158,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0);
    local_128.super_WriteStream._vptr_WriteStream = (_func_int **)&PTR_WriteData_024af290;
    local_d8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_b8.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_d8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_d8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.
         super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c0 = 0;
    ::std::vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>::~vector
              (&local_b8);
    MVar15 = MetadataWriter::GetMetaBlockPointer(&local_128);
    header.free_list = MVar15.block_pointer;
    local_160 = (_Hash_node_base *)
                (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    (**local_128.super_WriteStream._vptr_WriteStream)(&local_128,&local_160,8);
    p_Var5 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        local_160 = *(_Hash_node_base **)(p_Var5 + 1);
        (**local_128.super_WriteStream._vptr_WriteStream)(&local_128,&local_160,8);
        p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    local_160 = (_Hash_node_base *)(this->multi_use_blocks)._M_h._M_element_count;
    (**local_128.super_WriteStream._vptr_WriteStream)(&local_128,&local_160,8);
    p_Var13 = (this->multi_use_blocks)._M_h._M_before_begin._M_nxt;
    if (p_Var13 != (_Hash_node_base *)0x0) {
      do {
        local_160 = p_Var13[1]._M_nxt;
        (**local_128.super_WriteStream._vptr_WriteStream)(&local_128,&local_160,8);
        local_160 = (_Hash_node_base *)CONCAT44(local_160._4_4_,*(undefined4 *)&p_Var13[2]._M_nxt);
        (**local_128.super_WriteStream._vptr_WriteStream)(&local_128,&local_160,4);
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
    pMVar4 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    MetadataManager::Write(pMVar4,&local_128.super_WriteStream);
    MetadataWriter::Flush(&local_128);
    local_128.super_WriteStream._vptr_WriteStream = (_func_int **)&PTR_WriteData_024af290;
    ::std::vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>::~vector
              (&local_d8);
    MetadataWriter::~MetadataWriter(&local_128);
  }
  MetadataManager::Flush(local_158);
  header.block_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(this->max_block);
  this_00 = &(this->options).storage_version;
  header.serialization_compatibility = optional_idx::GetIndex(this_00);
  pDVar6 = DBConfig::Get(this->db);
  if ((pDVar6->options).checkpoint_abort != DEBUG_ABORT_AFTER_FREE_LIST_WRITE) {
    pFVar7 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(&this->handle);
    FileHandle::Sync(pFVar7);
    this_01 = &this->header_buffer;
    FileBuffer::Clear(this_01);
    this_02 = &(this->options).version_number;
    iVar8 = optional_idx::GetIndex(this_02);
    if (iVar8 == 0x40) {
      iVar8 = optional_idx::GetIndex(this_00);
      if (3 < iVar8) {
        this_02->index = 0x41;
        local_98[0] = optional_idx::GetIndex(this_02);
        local_98[3] = 0;
        local_98[4] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        pdVar2 = (this->header_buffer).buffer;
        piVar10 = local_98;
        piVar11 = (idx_t *)&stack0xfffffffffffffe38;
        for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
          *piVar11 = *piVar10;
          piVar10 = piVar10 + (ulong)bVar14 * -2 + 1;
          piVar11 = piVar11 + (ulong)bVar14 * -2 + 1;
        }
        SerializeHeaderStructure<duckdb::MainHeader>(in_stack_fffffffffffffe38,pdVar2);
        ChecksumAndWrite(this,this_01,0,false);
        FileBuffer::Clear(this_01);
      }
    }
    allocator_p = Allocator::Get(this->db);
    MemoryStream::MemoryStream((MemoryStream *)&local_128,allocator_p,0x200);
    DatabaseHeader::Write(&header,&local_128.super_WriteStream);
    pdVar2 = (this->header_buffer).buffer;
    __src = MemoryStream::GetData((MemoryStream *)&local_128);
    iVar8 = MemoryStream::GetPosition((MemoryStream *)&local_128);
    switchD_012dd528::default(pdVar2,__src,iVar8);
    ChecksumAndWrite(this,this_01,(ulong)(this->active_header != '\x01') * 0x1000 + 0x1000,false);
    this->active_header = '\x01' - this->active_header;
    pFVar7 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(&this->handle);
    FileHandle::Sync(pFVar7);
    TrimFreeBlocks(this);
    MemoryStream::~MemoryStream((MemoryStream *)&local_128);
    pthread_mutex_unlock(local_150);
    ::std::vector<duckdb::MetadataHandle,_std::allocator<duckdb::MetadataHandle>_>::~vector
              (&local_148);
    return;
  }
  this_03 = (FatalException *)__cxa_allocate_exception(0x10);
  local_128.super_WriteStream._vptr_WriteStream = (_func_int **)&local_128.block;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,
             "Checkpoint aborted after free list write because of PRAGMA checkpoint_abort flag","");
  FatalException::FatalException(this_03,FATAL,(string *)&local_128);
  __cxa_throw(this_03,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::WriteHeader(DatabaseHeader header) {
	auto free_list_blocks = GetFreeListBlocks();

	// now handle the free list
	auto &metadata_manager = GetMetadataManager();
	// add all modified blocks to the free list: they can now be written to again
	metadata_manager.MarkBlocksAsModified();

	lock_guard<mutex> lock(block_lock);
	// set the iteration count
	header.iteration = ++iteration_count;

	for (auto &block : modified_blocks) {
		free_list.insert(block);
		newly_freed_list.insert(block);
	}
	modified_blocks.clear();

	if (!free_list_blocks.empty()) {
		// there are blocks to write, either in the free_list or in the modified_blocks
		// we write these blocks specifically to the free_list_blocks
		// a normal MetadataWriter will fetch blocks to use from the free_list
		// but since we are WRITING the free_list, this behavior is sub-optimal
		FreeListBlockWriter writer(metadata_manager, std::move(free_list_blocks));

		auto ptr = writer.GetMetaBlockPointer();
		header.free_list = ptr.block_pointer;

		writer.Write<uint64_t>(free_list.size());
		for (auto &block_id : free_list) {
			writer.Write<block_id_t>(block_id);
		}
		writer.Write<uint64_t>(multi_use_blocks.size());
		for (auto &entry : multi_use_blocks) {
			writer.Write<block_id_t>(entry.first);
			writer.Write<uint32_t>(entry.second);
		}
		GetMetadataManager().Write(writer);
		writer.Flush();
	} else {
		// no blocks in the free list
		header.free_list = DConstants::INVALID_INDEX;
	}
	metadata_manager.Flush();
	header.block_count = NumericCast<idx_t>(max_block);
	header.serialization_compatibility = options.storage_version.GetIndex();

	auto &config = DBConfig::Get(db);
	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_AFTER_FREE_LIST_WRITE) {
		throw FatalException("Checkpoint aborted after free list write because of PRAGMA checkpoint_abort flag");
	}

	// We need to fsync BEFORE we write the header to ensure that all the previous blocks are written as well
	handle->Sync();

	header_buffer.Clear();
	// if we are upgrading the database from version 64 -> version 65, we need to re-write the main header
	if (options.version_number.GetIndex() == 64 && options.storage_version.GetIndex() >= 4) {
		// rewrite the main header
		options.version_number = 65;
		MainHeader main_header = ConstructMainHeader(options.version_number.GetIndex());
		SerializeHeaderStructure<MainHeader>(main_header, header_buffer.buffer);
		// now write the header to the file
		ChecksumAndWrite(header_buffer, 0);
		header_buffer.Clear();
	}

	// set the header inside the buffer
	MemoryStream serializer(Allocator::Get(db));
	header.Write(serializer);
	memcpy(header_buffer.buffer, serializer.GetData(), serializer.GetPosition());
	// now write the header to the file, active_header determines whether we write to h1 or h2
	// note that if active_header is h1 we write to h2, and vice versa
	ChecksumAndWrite(header_buffer, active_header == 1 ? Storage::FILE_HEADER_SIZE : Storage::FILE_HEADER_SIZE * 2);
	// switch active header to the other header
	active_header = 1 - active_header;
	//! Ensure the header write ends up on disk
	handle->Sync();
	// Release the free blocks to the filesystem.
	TrimFreeBlocks();
}